

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::can_use_io_location(CompilerGLSL *this,StorageClass storage,bool block)

{
  ExecutionModel EVar1;
  uint uVar2;
  uint32_t minimum_desktop_version;
  bool block_local;
  StorageClass storage_local;
  CompilerGLSL *this_local;
  
  EVar1 = Compiler::get_execution_model(&this->super_Compiler);
  if (((EVar1 != ExecutionModelVertex) && (storage == Input)) ||
     ((EVar1 = Compiler::get_execution_model(&this->super_Compiler), EVar1 != ExecutionModelFragment
      && (storage == Output)))) {
    uVar2 = 0x19a;
    if (block) {
      uVar2 = 0x1b8;
    }
    if (((((this->options).es & 1U) == 0) && ((this->options).version < uVar2)) &&
       (((this->options).separate_shader_objects & 1U) == 0)) {
      return false;
    }
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
      return false;
    }
  }
  EVar1 = Compiler::get_execution_model(&this->super_Compiler);
  if (((EVar1 == ExecutionModelVertex) && (storage == Input)) ||
     ((EVar1 = Compiler::get_execution_model(&this->super_Compiler), EVar1 == ExecutionModelFragment
      && (storage == Output)))) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 300)) {
      return false;
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x14a)) {
      return false;
    }
  }
  if (((storage == StorageClassUniform) || (storage == StorageClassUniformConstant)) ||
     (storage == PushConstant)) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
      return false;
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1ae)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool CompilerGLSL::can_use_io_location(StorageClass storage, bool block)
{
	// Location specifiers are must have in SPIR-V, but they aren't really supported in earlier versions of GLSL.
	// Be very explicit here about how to solve the issue.
	if ((get_execution_model() != ExecutionModelVertex && storage == StorageClassInput) ||
	    (get_execution_model() != ExecutionModelFragment && storage == StorageClassOutput))
	{
		uint32_t minimum_desktop_version = block ? 440 : 410;
		// ARB_enhanced_layouts vs ARB_separate_shader_objects ...

		if (!options.es && options.version < minimum_desktop_version && !options.separate_shader_objects)
			return false;
		else if (options.es && options.version < 310)
			return false;
	}

	if ((get_execution_model() == ExecutionModelVertex && storage == StorageClassInput) ||
	    (get_execution_model() == ExecutionModelFragment && storage == StorageClassOutput))
	{
		if (options.es && options.version < 300)
			return false;
		else if (!options.es && options.version < 330)
			return false;
	}

	if (storage == StorageClassUniform || storage == StorageClassUniformConstant || storage == StorageClassPushConstant)
	{
		if (options.es && options.version < 310)
			return false;
		else if (!options.es && options.version < 430)
			return false;
	}

	return true;
}